

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O1

int lj_lex_setup(lua_State *L,LexState *ls)

{
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  TValue *pTVar5;
  bool bVar6;
  LexChar LVar7;
  uint uVar8;
  int iVar9;
  GCstr *pGVar10;
  
  ls->L = L;
  ls->fs = (FuncState *)0x0;
  ppcVar1 = &ls->p;
  ls->tok = 0;
  ls->lookahead = 0x121;
  ls->p = (char *)0x0;
  ls->pe = (char *)0x0;
  ls->vstack = (VarInfo *)0x0;
  ls->sizevstack = 0;
  ls->vtop = 0;
  *(undefined8 *)&ls->vtop = 0;
  *(undefined8 *)((long)&ls->bcstack + 4) = 0;
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->endmark = 0;
  LVar7 = lex_more(ls);
  ls->c = LVar7;
  bVar6 = false;
  if (LVar7 == 0xef) {
    pcVar3 = ls->p;
    pcVar2 = pcVar3 + 2;
    if (((pcVar2 <= ls->pe) && (*pcVar3 == -0x45)) && (bVar6 = false, pcVar3[1] == -0x41)) {
      *ppcVar1 = pcVar2;
      if (pcVar2 < ls->pe) {
        *ppcVar1 = pcVar3 + 3;
        uVar8 = (uint)(byte)pcVar3[2];
      }
      else {
        uVar8 = lex_more(ls);
      }
      ls->c = uVar8;
      bVar6 = true;
    }
  }
  if (ls->c == 0x23) {
    do {
      pbVar4 = (byte *)ls->p;
      if (pbVar4 < ls->pe) {
        *ppcVar1 = (char *)(pbVar4 + 1);
        uVar8 = (uint)*pbVar4;
      }
      else {
        uVar8 = lex_more(ls);
      }
      ls->c = uVar8;
      if (uVar8 == 0xffffffff) {
        return 0;
      }
    } while ((uVar8 != 0xd) && (uVar8 != 10));
    lex_newline(ls);
    bVar6 = true;
  }
  iVar9 = 0;
  if ((ls->c == 0x1b) && (iVar9 = 1, bVar6)) {
    pTVar5 = L->top;
    L->top = pTVar5 + 1;
    pGVar10 = lj_err_str(L,LJ_ERR_BCBAD);
    pTVar5->u64 = (ulong)pGVar10 | 0xfffd800000000000;
    lj_err_throw(L,3);
  }
  return iVar9;
}

Assistant:

int lj_lex_setup(lua_State *L, LexState *ls)
{
  int header = 0;
  ls->L = L;
  ls->fs = NULL;
  ls->pe = ls->p = NULL;
  ls->vstack = NULL;
  ls->sizevstack = 0;
  ls->vtop = 0;
  ls->bcstack = NULL;
  ls->sizebcstack = 0;
  ls->tok = 0;
  ls->lookahead = TK_eof;  /* No look-ahead token. */
  ls->linenumber = 1;
  ls->lastline = 1;
  ls->endmark = 0;
  lex_next(ls);  /* Read-ahead first char. */
  if (ls->c == 0xef && ls->p + 2 <= ls->pe && (uint8_t)ls->p[0] == 0xbb &&
      (uint8_t)ls->p[1] == 0xbf) {  /* Skip UTF-8 BOM (if buffered). */
    ls->p += 2;
    lex_next(ls);
    header = 1;
  }
  if (ls->c == '#') {  /* Skip POSIX #! header line. */
    do {
      lex_next(ls);
      if (ls->c == LEX_EOF) return 0;
    } while (!lex_iseol(ls));
    lex_newline(ls);
    header = 1;
  }
  if (ls->c == LUA_SIGNATURE[0]) {  /* Bytecode dump. */
    if (header) {
      /*
      ** Loading bytecode with an extra header is disabled for security
      ** reasons. This may circumvent the usual check for bytecode vs.
      ** Lua code by looking at the first char. Since this is a potential
      ** security violation no attempt is made to echo the chunkname either.
      */
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_BCBAD));
      lj_err_throw(L, LUA_ERRSYNTAX);
    }
    return 1;
  }
  return 0;
}